

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShiftRoll.hpp
# Opt level: O2

void InstructionSet::x86::Primitive::
     rol<unsigned_char,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
               (modify_t<unsigned_char> destination,uint8_t count,Context *context)

{
  byte bVar1;
  undefined3 in_register_00000031;
  
  if (CONCAT31(in_register_00000031,count) != 0) {
    bVar1 = *destination;
    if ((count & 7) != 0) {
      bVar1 = bVar1 << (count & 7) | bVar1 >> 8 - (count & 7);
      *destination = bVar1;
    }
    (context->flags).carry_ = (uint)(bVar1 & 1);
    (context->flags).overflow_ = *destination & 1 ^ (uint)(*destination >> 7);
  }
  return;
}

Assistant:

void rol(
	modify_t<IntT> destination,
	uint8_t count,
	ContextT &context
) {
	/*
		(* ROL and ROR instructions *)
		SIZE ← OperandSize
		CASE (determine count) OF
			SIZE = 8:	tempCOUNT ← COUNT MOD 8;
			SIZE = 16:	tempCOUNT ← COUNT MOD 16;
			SIZE = 32:	tempCOUNT ← COUNT MOD 32;
		ESAC;
	*/
	/*
		(* ROL instruction operation *)
		WHILE (tempCOUNT ≠ 0)
			DO
				tempCF ← MSB(DEST);
				DEST ← (DEST * 2) + tempCF;
				tempCOUNT ← tempCOUNT – 1;
			OD;
		ELIHW;
		IF COUNT = 1
			THEN OF ← MSB(DEST) XOR CF;
			ELSE OF is undefined;
		FI;
	*/
	/*
		The CF flag contains the value of the bit shifted into it.
		The OF flag is affected only for single- bit rotates (see “Description” above);
		it is undefined for multi-bit rotates. The SF, ZF, AF, and PF flags are not affected.
	*/
	const auto temp_count = count & (Numeric::bit_size<IntT>() - 1);
	if(!count) {
		// TODO: is this 8086-specific? i.e. do the other x86s also exit without affecting flags when temp_count = 0?
		return;
	}
	if(temp_count) {
		destination = IntT(
			(destination << temp_count) |
			(destination >> (Numeric::bit_size<IntT>() - temp_count))
		);
	}

	context.flags.template set_from<Flag::Carry>(destination & 1);
	context.flags.template set_from<Flag::Overflow>(
		((destination >> (Numeric::bit_size<IntT>() - 1)) ^ destination) & 1
	);
}